

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_UInt *pFVar1;
  short sVar2;
  FT_Int FVar3;
  FT_GlyphSlot slot;
  undefined8 *puVar4;
  void *pvVar5;
  FT_Memory pFVar6;
  FT_Driver pFVar7;
  FT_Module pFVar8;
  FT_Face_Internal pFVar9;
  long lVar10;
  FT_Module_Class *pFVar11;
  FT_Size pFVar12;
  ulong uVar13;
  FT_Library pFVar14;
  long lVar15;
  FT_Render_Mode render_mode;
  uint uVar16;
  FT_Error FVar17;
  int iVar18;
  int iVar19;
  FT_Render_Mode FVar20;
  char *pcVar21;
  FT_Pos FVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  FT_ListNode pFVar26;
  FT_Vector *pFVar27;
  ulong uVar28;
  FT_Renderer_conflict pFVar29;
  FT_Module module;
  bool bVar30;
  
  if (face == (FT_Face)0x0) {
    return 0x23;
  }
  if (face->size == (FT_Size)0x0) {
    return 0x23;
  }
  slot = face->glyph;
  if (slot == (FT_GlyphSlot)0x0) {
    return 0x23;
  }
  ft_glyphslot_free_bitmap(slot);
  slot->glyph_index = 0;
  (slot->metrics).width = 0;
  (slot->metrics).height = 0;
  (slot->metrics).horiBearingX = 0;
  (slot->metrics).horiBearingY = 0;
  (slot->metrics).horiAdvance = 0;
  (slot->metrics).vertBearingX = 0;
  (slot->metrics).vertBearingY = 0;
  (slot->metrics).vertAdvance = 0;
  (slot->bitmap).rows = 0;
  (slot->bitmap).width = 0;
  (slot->bitmap).pitch = 0;
  (slot->bitmap).pixel_mode = '\0';
  slot->bitmap_left = 0;
  slot->bitmap_top = 0;
  (slot->outline).n_contours = 0;
  (slot->outline).n_points = 0;
  *(undefined4 *)&(slot->outline).field_0x4 = 0;
  (slot->outline).points = (FT_Vector *)0x0;
  (slot->outline).tags = (char *)0x0;
  (slot->outline).contours = (short *)0x0;
  *(undefined8 *)&(slot->outline).flags = 0;
  slot->num_subglyphs = 0;
  slot->subglyphs = (FT_SubGlyph)0x0;
  slot->control_data = (void *)0x0;
  slot->control_len = 0;
  if ((slot->face->face_flags & 0x10000) == 0) {
    slot->other = (void *)0x0;
  }
  else if ((slot->internal->flags & 2) != 0) {
    puVar4 = (undefined8 *)slot->other;
    pvVar5 = (void *)*puVar4;
    if (pvVar5 != (void *)0x0) {
      pFVar6 = slot->face->memory;
      (*pFVar6->free)(pFVar6,pvVar5);
    }
    *puVar4 = 0;
    pFVar1 = &slot->internal->flags;
    *pFVar1 = *pFVar1 & 0xfffffffd;
  }
  (slot->advance).x = 0;
  (slot->advance).y = 0;
  slot->linearHoriAdvance = 0;
  slot->linearVertAdvance = 0;
  slot->format = FT_GLYPH_FORMAT_NONE;
  slot->lsb_delta = 0;
  slot->rsb_delta = 0;
  pFVar7 = face->driver;
  pFVar8 = ((pFVar7->root).library)->auto_hinter;
  if (((face->size->metrics).x_ppem == 0) || ((face->size->metrics).y_ppem == 0)) {
    load_flags = load_flags | 1;
  }
  uVar16 = load_flags | 0x801;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar16 = load_flags;
  }
  uVar23 = uVar16 & 0xfffffff1 | 10;
  if ((uVar16 & 1) == 0) {
    uVar23 = uVar16;
  }
  uVar16 = uVar23 & 0xfffffffb;
  if ((uVar23 >> 0x16 & 1) == 0) {
    uVar16 = uVar23;
  }
  if (((pFVar8 == (FT_Module)0x0) || ((uVar16 & 0x8002) != 0)) || ((face->face_flags & 0x2001) != 1)
     ) {
LAB_0021477c:
    FVar17 = (*pFVar7->clazz->load_glyph)(slot,face->size,glyph_index,uVar16);
    if (FVar17 != 0) {
      return FVar17;
    }
    iVar18 = 0;
    if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
      FVar17 = FT_Outline_Check(&slot->outline);
      if (FVar17 != 0) {
        return FVar17;
      }
      if ((uVar16 & 2) == 0) {
        ft_glyphslot_grid_fit_metrics(slot,(byte)(uVar16 >> 4) & 1);
      }
    }
  }
  else {
    if ((uVar16 >> 0xb & 1) == 0) {
      pFVar9 = face->internal;
      lVar10 = (pFVar9->transform_matrix).yx;
      if (((lVar10 != 0) || ((pFVar9->transform_matrix).xx == 0)) &&
         ((lVar10 == 0 || ((pFVar9->transform_matrix).xx != 0)))) goto LAB_0021477c;
    }
    if (((uVar16 & 0x20) == 0) &&
       (pFVar11 = (pFVar7->root).clazz, (pFVar11->module_flags & 0x400) != 0)) {
      pcVar21 = (char *)(*pFVar11->get_interface)(&pFVar7->root,"font-format");
      pcVar21 = strstr(pcVar21,"Type 1");
      if (pcVar21 == (char *)0x0) {
        bVar30 = false;
      }
      else {
        bVar30 = *(int *)&pFVar7[1].root.clazz == 1;
      }
      if ((((uVar16 & 0xf0000) != 0x10000) ||
          ((*(byte *)((long)&((pFVar7->root).clazz)->module_flags + 1) >> 3 & 1) != 0 || bVar30)) &&
         ((((face->face_flags & 8) == 0 ||
           (((face[5].style_flags == 0 || (*(short *)((long)&face[1].extensions + 6) != 0)) ||
            (face[4].bbox.xMax != 0)))) ||
          (lVar10._0_2_ = face[4].units_per_EM, lVar10._2_2_ = face[4].ascender,
          lVar10._4_2_ = face[4].descender, lVar10._6_2_ = face[4].height, lVar10 != 0))))
      goto LAB_0021477c;
    }
    if (((((face->face_flags & 0x10000) == 0) ||
         (FVar17 = (*pFVar7->clazz->load_glyph)(slot,face->size,glyph_index,uVar16 | 0x800000),
         FVar17 != 0)) || (slot->format != FT_GLYPH_FORMAT_SVG)) &&
       ((((face->face_flags & 2) == 0 || ((uVar16 & 8) != 0)) ||
        ((FVar17 = (*pFVar7->clazz->load_glyph)(slot,face->size,glyph_index,uVar16 | 0x4000),
         FVar17 != 0 || (slot->format != FT_GLYPH_FORMAT_BITMAP)))))) {
      pFVar9 = face->internal;
      FVar3 = pFVar9->transform_flags;
      pFVar9->transform_flags = 0;
      iVar18 = (**(code **)((long)pFVar8->clazz->module_interface + 0x18))
                         (pFVar8,slot,face->size,glyph_index,uVar16);
      pFVar9->transform_flags = FVar3;
    }
    else {
      iVar18 = 0;
    }
  }
  if ((uVar16 & 0x10) == 0) {
    (slot->advance).x = (slot->metrics).horiAdvance;
    FVar22 = 0;
  }
  else {
    (slot->advance).x = 0;
    FVar22 = (slot->metrics).vertAdvance;
  }
  (slot->advance).y = FVar22;
  if (((uVar16 >> 0xd & 1) == 0) && ((face->face_flags & 1) != 0)) {
    pFVar12 = face->size;
    uVar13 = (pFVar12->metrics).x_scale;
    uVar24 = -uVar13;
    if (0 < (long)uVar13) {
      uVar24 = uVar13;
    }
    uVar25 = slot->linearHoriAdvance;
    uVar28 = -uVar25;
    if (0 < (long)uVar25) {
      uVar28 = uVar25;
    }
    uVar28 = uVar28 * uVar24 + 0x20 >> 6;
    uVar24 = -uVar28;
    if (-1 < (long)(uVar13 ^ uVar25)) {
      uVar24 = uVar28;
    }
    uVar13 = slot->linearVertAdvance;
    slot->linearHoriAdvance = uVar24;
    uVar24 = (pFVar12->metrics).y_scale;
    uVar25 = -uVar24;
    if (0 < (long)uVar24) {
      uVar25 = uVar24;
    }
    uVar28 = -uVar13;
    if (0 < (long)uVar13) {
      uVar28 = uVar13;
    }
    uVar28 = uVar28 * uVar25 + 0x20 >> 6;
    uVar25 = -uVar28;
    if (-1 < (long)(uVar24 ^ uVar13)) {
      uVar25 = uVar28;
    }
    slot->linearVertAdvance = uVar25;
  }
  if ((uVar16 >> 0xb & 1) == 0) {
    pFVar9 = face->internal;
    if (pFVar9->transform_flags != 0) {
      pFVar14 = (slot->face->driver->root).library;
      pFVar29 = pFVar14->cur_renderer;
      if ((pFVar29 == (FT_Renderer_conflict)0x0) || (pFVar29->glyph_format != slot->format)) {
        if (pFVar14 == (FT_Library)0x0) {
          pFVar29 = (FT_Renderer_conflict)0x0;
        }
        else {
          pFVar26 = (pFVar14->renderers).head;
          while ((pFVar29 = (FT_Renderer_conflict)0x0, pFVar26 != (FT_ListNode)0x0 &&
                 (pFVar29 = (FT_Renderer_conflict)pFVar26->data,
                 pFVar29->glyph_format != slot->format))) {
            pFVar26 = pFVar26->next;
          }
        }
      }
      if (pFVar29 == (FT_Renderer_conflict)0x0) {
        if (slot->format == FT_GLYPH_FORMAT_OUTLINE) {
          if ((pFVar9->transform_flags & 1U) != 0) {
            FT_Outline_Transform(&slot->outline,&pFVar9->transform_matrix);
          }
          if (((pFVar9->transform_flags & 2) != 0) &&
             (sVar2 = (slot->outline).n_points, iVar19 = (int)sVar2, 0 < sVar2)) {
            lVar10 = (pFVar9->transform_delta).x;
            lVar15 = (pFVar9->transform_delta).y;
            pFVar27 = (slot->outline).points;
            do {
              pFVar27->x = pFVar27->x + lVar10;
              pFVar27->y = pFVar27->y + lVar15;
              pFVar27 = pFVar27 + 1;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
        }
      }
      else {
        iVar18 = (*pFVar29->clazz->transform_glyph)
                           (pFVar29,slot,&pFVar9->transform_matrix,&pFVar9->transform_delta);
      }
      FT_Vector_Transform(&slot->advance,&pFVar9->transform_matrix);
    }
  }
  slot->glyph_index = glyph_index;
  slot->internal->load_flags = uVar16;
  if (iVar18 == 0) {
    iVar18 = 0;
    if ((((uVar16 & 1) == 0) && (slot->format != FT_GLYPH_FORMAT_BITMAP)) &&
       (iVar18 = 0, slot->format != FT_GLYPH_FORMAT_COMPOSITE)) {
      FVar20 = uVar16 >> 0x10 & 0xf;
      render_mode = uVar16 >> 0xb & FT_RENDER_MODE_MONO;
      if (FVar20 != FT_RENDER_MODE_NORMAL) {
        render_mode = FVar20;
      }
      if ((uVar16 & 4) == 0) {
        iVar18 = 0;
        ft_glyphslot_preset_bitmap(slot,render_mode,(FT_Vector *)0x0);
      }
      else {
        if (slot->face != (FT_Face)0x0) {
          FVar17 = FT_Render_Glyph_Internal((slot->face->driver->root).library,slot,render_mode);
          return FVar17;
        }
        iVar18 = 6;
      }
    }
  }
  return iVar18;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* undefined scale means no scale */
    if ( face->size->metrics.x_ppem == 0 ||
         face->size->metrics.y_ppem == 0 )
      load_flags |= FT_LOAD_NO_SCALE;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_IS_SCALABLE( face )                           &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* XXX: The use of the `FT_LOAD_XXX_ONLY` flags is not very */
      /*      elegant.                                            */

      /* try to load SVG documents if available */
      if ( FT_HAS_SVG( face ) )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SVG_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_SVG )
          goto Load_Ok;
      }

      /* try to load embedded bitmaps if available */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics(
            slot,
            FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    slot->glyph_index          = glyph_index;
    slot->internal->load_flags = load_flags;

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE5(( "FT_Load_Glyph: index %d, flags 0x%x\n",
                glyph_index, load_flags ));
    FT_TRACE5(( "  bitmap %dx%d %s, %s (mode %d)\n",
                slot->bitmap.width,
                slot->bitmap.rows,
                slot->outline.points ?
                  slot->bitmap.buffer ? "rendered"
                                      : "preset"
                                     :
                  slot->internal->flags & FT_GLYPH_OWN_BITMAP ? "owned"
                                                              : "unowned",
                pixel_modes[slot->bitmap.pixel_mode],
                slot->bitmap.pixel_mode ));
    FT_TRACE5(( "\n" ));
    FT_TRACE5(( "  x advance: %f\n", (double)slot->advance.x / 64 ));
    FT_TRACE5(( "  y advance: %f\n", (double)slot->advance.y / 64 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                (double)slot->linearHoriAdvance / 65536 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                (double)slot->linearVertAdvance / 65536 ));

    {
      FT_Glyph_Metrics*  metrics = &slot->metrics;


      FT_TRACE5(( "  metrics:\n" ));
      FT_TRACE5(( "    width:  %f\n", (double)metrics->width / 64 ));
      FT_TRACE5(( "    height: %f\n", (double)metrics->height / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    horiBearingX: %f\n",
                  (double)metrics->horiBearingX / 64 ));
      FT_TRACE5(( "    horiBearingY: %f\n",
                  (double)metrics->horiBearingY / 64 ));
      FT_TRACE5(( "    horiAdvance:  %f\n",
                  (double)metrics->horiAdvance / 64 ));
      FT_TRACE5(( "\n" ));
      FT_TRACE5(( "    vertBearingX: %f\n",
                  (double)metrics->vertBearingX / 64 ));
      FT_TRACE5(( "    vertBearingY: %f\n",
                  (double)metrics->vertBearingY / 64 ));
      FT_TRACE5(( "    vertAdvance:  %f\n",
                  (double)metrics->vertAdvance / 64 ));
    }
#endif

  Exit:
    return error;
  }